

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Regex.cpp
# Opt level: O2

void __thiscall Regex::~Regex(Regex *this)

{
  std::__cxx11::string::~string((string *)&this->mErrorData);
  JetHead::vector<Regex::GroupData>::~vector(&this->mGroups);
  Element::~Element(&this->mRoot);
  return;
}

Assistant:

Regex::~Regex()
{
}